

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc,TestFactoryBase *factory)

{
  TestInfo *this;
  UnitTestImpl *this_00;
  long in_FS_OFFSET;
  TestInfo *test_info;
  TypeId fixture_class_id_local;
  CodeLocation *code_location_local;
  char *value_param_local;
  char *type_param_local;
  char *name_local;
  char *test_case_name_local;
  CodeLocation local_78;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this = (TestInfo *)operator_new(0x108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,test_case_name,(allocator<char> *)((long)&test_case_name_local + 7)
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,name,(allocator<char> *)((long)&test_case_name_local + 6));
  CodeLocation::CodeLocation(&local_78,code_location);
  TestInfo::TestInfo(this,&local_30,&local_50,type_param,value_param,&local_78,fixture_class_id,
                     factory);
  CodeLocation::~CodeLocation(&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&test_case_name_local + 6));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)((long)&test_case_name_local + 7));
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,set_up_tc,tear_down_tc,this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    CodeLocation code_location,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}